

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ConcatNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_concatnd(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x3d4) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3d4;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.concatnd_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ConcatNDLayerParams>
                   (arena);
    (this->layer_).concatnd_ = (ConcatNDLayerParams *)LVar2;
  }
  return (ConcatNDLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::ConcatNDLayerParams* NeuralNetworkLayer::_internal_mutable_concatnd() {
  if (!_internal_has_concatnd()) {
    clear_layer();
    set_has_concatnd();
    layer_.concatnd_ = CreateMaybeMessage< ::CoreML::Specification::ConcatNDLayerParams >(GetArenaForAllocation());
  }
  return layer_.concatnd_;
}